

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Int8_To_Int32(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride
                  ,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  int *local_40;
  PaInt32 *dest;
  char *src;
  PaUtilTriangularDitherGenerator *ditherGenerator_local;
  uint count_local;
  int sourceStride_local;
  void *sourceBuffer_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  local_40 = (int *)destinationBuffer;
  dest = (PaInt32 *)sourceBuffer;
  ditherGenerator_local._0_4_ = count;
  while ((uint)ditherGenerator_local != 0) {
    *local_40 = (int)(char)*dest << 0x18;
    dest = (PaInt32 *)((long)dest + (long)sourceStride);
    local_40 = local_40 + destinationStride;
    ditherGenerator_local._0_4_ = (uint)ditherGenerator_local - 1;
  }
  return;
}

Assistant:

static void Int8_To_Int32(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    signed char *src = (signed char*)sourceBuffer;
    PaInt32 *dest =  (PaInt32*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
		(*dest) = (*src) << 24;

        src += sourceStride;
        dest += destinationStride;
    }
}